

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QList<int> * __thiscall
QMainWindowLayoutState::gapIndex
          (QList<int> *__return_storage_ptr__,QMainWindowLayoutState *this,QWidget *widget,
          QPoint *pos)

{
  int *piVar1;
  long lVar2;
  QDockWidgetGroupWindow *this_00;
  QDockAreaLayoutInfo *pQVar3;
  long in_FS_OFFSET;
  bool disallowTabs;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  lVar2 = QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (lVar2 == 0) {
    lVar2 = QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (lVar2 == 0) {
      lVar2 = QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (lVar2 == 0) goto LAB_0042ffc2;
    }
    this_00 = (QDockWidgetGroupWindow *)
              QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
    if (this_00 == (QDockWidgetGroupWindow *)0x0) {
      disallowTabs = false;
    }
    else {
      pQVar3 = QDockWidgetGroupWindow::tabLayoutInfo(this_00);
      disallowTabs = pQVar3 == (QDockAreaLayoutInfo *)0x0;
    }
    QDockAreaLayout::gapIndex((QList<int> *)&local_40,&this->dockAreaLayout,pos,disallowTabs);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    piVar1 = (int *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_),4,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) goto LAB_0042ffc2;
    local_40.d._0_4_ = 1;
  }
  else {
    QToolBarAreaLayout::gapIndex((QList<int> *)&local_40,&this->toolBarAreaLayout,pos);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    piVar1 = (int *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_40.d._4_4_,local_40.d._0_4_),4,0x10);
      }
    }
    if ((__return_storage_ptr__->d).size == 0) goto LAB_0042ffc2;
    local_40.d._0_4_ = 0;
  }
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)&local_40);
LAB_0042ffc2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QMainWindowLayoutState::gapIndex(QWidget *widget,
                                            const QPoint &pos) const
{
    QList<int> result;

#if QT_CONFIG(toolbar)
    // is it a toolbar?
    if (qobject_cast<QToolBar*>(widget) != nullptr) {
        result = toolBarAreaLayout.gapIndex(pos);
        if (!result.isEmpty())
            result.prepend(0);
        return result;
    }
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (qobject_cast<QDockWidget *>(widget) != nullptr
            || qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        bool disallowTabs = false;
#if QT_CONFIG(tabbar)
        if (auto *group = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
            if (!group->tabLayoutInfo()) // Disallow to drop nested docks as a tab
                disallowTabs = true;
        }
#endif
        result = dockAreaLayout.gapIndex(pos, disallowTabs);
        if (!result.isEmpty())
            result.prepend(1);
        return result;
    }
#endif // QT_CONFIG(dockwidget)

    return result;
}